

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::createAtCall(FunctionResolver *this,CallOrCast *call)

{
  CallOrCastBase *pCVar1;
  Statement *pSVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  CommaSeparatedList *pCVar6;
  pool_ref<soul::AST::Expression> *ppVar7;
  Expression *pEVar8;
  EndpointDeclaration *pEVar9;
  EndpointDetails *pEVar10;
  Expression *pEVar11;
  Constant *pCVar12;
  ArraySize AVar13;
  ArrayElementRef *pAVar14;
  bool local_1d1;
  void *local_1d0 [2];
  ArrayElementRef *ref;
  CompileMessage local_188;
  undefined1 local_150 [8];
  Type arrayType;
  pool_ptr<soul::AST::Constant> local_100;
  pool_ptr<soul::AST::Expression> local_f8;
  int local_ec;
  undefined1 local_e8 [4];
  BoundedIntSize arraySize;
  pool_ptr<soul::AST::EndpointDeclaration> local_b0;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  pool_ptr<soul::AST::Expression> endpointArraySize;
  Type local_88;
  Expression *local_70;
  Expression *index;
  Expression *array;
  CompileMessage local_50;
  CallOrCast *local_18;
  CallOrCast *call_local;
  FunctionResolver *this_local;
  
  local_18 = call;
  call_local = (CallOrCast *)this;
  sVar5 = AST::CallOrCastBase::getNumArguments(&call->super_CallOrCastBase);
  if (sVar5 != 2) {
    pCVar1 = &local_18->super_CallOrCastBase;
    Errors::atMethodTakes1Arg<>();
    AST::Context::throwError
              (&(pCVar1->super_Expression).super_Statement.super_ASTObject.context,&local_50,false);
  }
  pCVar6 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                     (&(local_18->super_CallOrCastBase).arguments);
  ppVar7 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                     (&pCVar6->items,0);
  index = pool_ref<soul::AST::Expression>::get(ppVar7);
  pCVar6 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                     (&(local_18->super_CallOrCastBase).arguments);
  ppVar7 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                     (&pCVar6->items,1);
  pEVar8 = pool_ref<soul::AST::Expression>::get(ppVar7);
  local_70 = pEVar8;
  Type::Type(&local_88,int64);
  iVar4 = (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(pEVar8,&local_88);
  Type::~Type(&local_88);
  if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
    pCVar1 = &local_18->super_CallOrCastBase;
    Type::Type((Type *)&endpointArraySize,int32);
    SanityCheckPass::expectSilentCastPossible
              (&(pCVar1->super_Expression).super_Statement.super_ASTObject.context,
               (Type *)&endpointArraySize,local_70);
    Type::~Type((Type *)&endpointArraySize);
  }
  if (index->kind == endpoint) {
    bVar3 = AST::isResolvedAsOutput(index);
    checkAssertion(bVar3,"AST::isResolvedAsOutput (array)","createAtCall",0xa39);
    pool_ptr<soul::AST::Expression>::pool_ptr((pool_ptr<soul::AST::Expression> *)&endpoint);
    (*(index->super_Statement).super_ASTObject._vptr_ASTObject[8])(&local_b0);
    bVar3 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_b0);
    if (bVar3) {
      pEVar9 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_b0);
      bVar3 = AST::EndpointDeclaration::isUnresolvedChildReference(pEVar9);
      if (bVar3) {
        pSVar2 = &index->super_Statement;
        Errors::cannotResolveSourceOfAtMethod<>();
        AST::Context::throwError
                  (&(pSVar2->super_ASTObject).context,(CompileMessage *)local_e8,false);
      }
      pEVar9 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_b0);
      pEVar10 = AST::EndpointDeclaration::getDetails(pEVar9);
      endpoint.object = (EndpointDeclaration *)(pEVar10->arraySize).object;
    }
    pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_b0);
    local_ec = 0;
    bVar3 = pool_ptr<soul::AST::Expression>::operator!=
                      ((pool_ptr<soul::AST::Expression> *)&endpoint,(void *)0x0);
    if (bVar3) {
      local_f8.object = (Expression *)endpoint.object;
      bVar3 = AST::isResolvedAsConstant(&local_f8);
      checkAssertion(bVar3,"AST::isResolvedAsConstant (endpointArraySize)","createAtCall",0xa48);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_f8);
      pEVar8 = pool_ptr<soul::AST::Expression>::operator->
                         ((pool_ptr<soul::AST::Expression> *)&endpoint);
      pEVar11 = pool_ptr<soul::AST::Expression>::operator->
                          ((pool_ptr<soul::AST::Expression> *)&endpoint);
      (*(pEVar11->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_100);
      pCVar12 = pool_ptr<soul::AST::Constant>::operator->(&local_100);
      AVar13 = TypeRules::checkAndGetArraySize<soul::AST::Context&>
                         (&(pEVar8->super_Statement).super_ASTObject.context,&pCVar12->value);
      local_ec = (int)AVar13;
      pool_ptr<soul::AST::Constant>::~pool_ptr(&local_100);
    }
    if (local_ec == 0) {
      pCVar1 = &local_18->super_CallOrCastBase;
      Errors::wrongTypeForAtMethod<>();
      AST::Context::throwError
                (&(pCVar1->super_Expression).super_Statement.super_ASTObject.context,
                 (CompileMessage *)&arrayType.structure,false);
    }
    pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&endpoint);
  }
  else {
    if (index->kind != value) {
      pCVar1 = &local_18->super_CallOrCastBase;
      Errors::expectedValueOrEndpoint<>();
      AST::Context::throwError
                (&(pCVar1->super_Expression).super_Statement.super_ASTObject.context,
                 (CompileMessage *)&ref,false);
    }
    (*(index->super_Statement).super_ASTObject._vptr_ASTObject[4])();
    bVar3 = Type::isArrayOrVector((Type *)local_150);
    if (!bVar3) {
      pCVar1 = &local_18->super_CallOrCastBase;
      Errors::wrongTypeForAtMethod<>();
      AST::Context::throwError
                (&(pCVar1->super_Expression).super_Statement.super_ASTObject.context,&local_188,
                 false);
    }
    Type::~Type((Type *)local_150);
  }
  local_1d0[0] = (void *)0x0;
  local_1d1 = false;
  pAVar14 = AST::Allocator::
            allocate<soul::AST::ArrayElementRef,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,decltype(nullptr),bool>
                      ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                       &(local_18->super_CallOrCastBase).super_Expression.super_Statement.
                        super_ASTObject.context,index,local_70,local_1d0,&local_1d1);
  pAVar14->suppressWrapWarning = true;
  return &pAVar14->super_Expression;
}

Assistant:

AST::Expression& createAtCall (AST::CallOrCast& call)
        {
            if (call.getNumArguments() != 2)
                call.context.throwError (Errors::atMethodTakes1Arg());

            auto& array = call.arguments->items[0].get();
            auto& index = call.arguments->items[1].get();

            if (! index.canSilentlyCastTo (PrimitiveType::int64))
                SanityCheckPass::expectSilentCastPossible (call.context, Type (PrimitiveType::int32), index);

            if (array.kind == AST::ExpressionKind::endpoint)
            {
                SOUL_ASSERT (AST::isResolvedAsOutput (array));
                pool_ptr<AST::Expression> endpointArraySize;

                if (auto endpoint = array.getAsEndpoint())
                {
                    if (endpoint->isUnresolvedChildReference())
                        array.context.throwError (Errors::cannotResolveSourceOfAtMethod());

                    endpointArraySize = endpoint->getDetails().arraySize;
                }

                Type::BoundedIntSize arraySize = 0;

                if (endpointArraySize != nullptr)
                {
                    SOUL_ASSERT (AST::isResolvedAsConstant (endpointArraySize));
                    arraySize = static_cast<Type::BoundedIntSize> (TypeRules::checkAndGetArraySize (endpointArraySize->context,
                                                                                                    endpointArraySize->getAsConstant()->value));
                }

                if (arraySize == 0)
                    call.context.throwError (Errors::wrongTypeForAtMethod());
            }
            else if (array.kind == AST::ExpressionKind::value)
            {
                auto arrayType = array.getResultType();

                if (! arrayType.isArrayOrVector())
                    call.context.throwError (Errors::wrongTypeForAtMethod());
            }
            else
            {
                call.context.throwError (Errors::expectedValueOrEndpoint());
            }

            auto& ref = allocator.allocate<AST::ArrayElementRef> (call.context, array, index, nullptr, false);
            ref.suppressWrapWarning = true;
            return ref;
        }